

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GLSL420Pack::InitializerListNegativeTest::getInitialization_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListNegativeTest *this)

{
  int iVar1;
  pointer pTVar2;
  TestError *this_00;
  
  iVar1 = this->m_current_test_case_index;
  pTVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::GLSL420Pack::InitializerListNegativeTest::TESTED_ERRORS,_std::allocator<gl4cts::GLSL420Pack::InitializerListNegativeTest::TESTED_ERRORS>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (pTVar2[iVar1] < TESTED_ERRORS_MAX) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x3a9d);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string InitializerListNegativeTest::getInitialization()
{
	const TESTED_ERRORS& error = m_test_cases[m_current_test_case_index];

	std::string initialization;

	switch (error)
	{
	case TYPE_UIVEC_BOOL:
		initialization = "{ true, 0, 1, 2 }";

		break;

	case TYPE_IVEC_BOOL:
		initialization = "{ true, 0, -1, 2 }";

		break;

	case TYPE_VEC_BOOL:
		initialization = "{ true, 0.125, 0.25, 0.375 }";

		break;

	case TYPE_MAT_BOOL:
		initialization = "{ {false, 0, 1, 1}, {0, 1, 0, 1}, {1, 0, 1, 0}, {0, 1, 0, 1} }";

		break;

	case COMPONENTS_VEC_LESS:
	case COMPONENTS_VEC_MORE:
		initialization = "{ 0, 0.25, 0.375 }";

		break;

	case COMPONENTS_MAT_LESS_ROWS:
		initialization = "{ {0, 0, 1, 1}, {0, 0, 1}, {1, 0, 1, 0}, {0, 1, 0, 1} }";

		break;

	case COMPONENTS_MAT_MORE_ROWS:
		initialization = "{ {0, 0, 1}, {0, 0, 1}, {1, 0, 1, 0}, {1, 0, 1} }";

		break;

	case COMPONENTS_MAT_LESS_COLUMNS:
		initialization = "{ {0, 0, 1, 1}, {1, 0, 1, 0}, {0, 1, 0, 1} }";

		break;

	case COMPONENTS_MAT_MORE_COLUMNS:
		initialization = "{ {0, 0, 1}, {0, 0, 1}, {1, 0, 1}, {1, 0, 1} }";

		break;

	case LIST_IN_CONSTRUCTOR:
		initialization = "Struct( { vec4(0, 1, 0, 1), vec3(0, 1, 0) }, vec4(1, 0, 1, 0) )";

		break;

	case STRUCT_LAYOUT_MEMBER_TYPE:
		initialization = "{ { {0, 1, 0, 1}, vec4(0, 1, 0, 1) }, vec4(1, 0, 1, 0) }";

		break;

	case STRUCT_LAYOUT_MEMBER_COUNT_MORE:
		initialization = "{ { {0, 1, 0, 1}, vec3(0, 1, 0) } , vec4(1, 0, 1, 0), vec4(1, 0, 1, 0) }";

		break;

	case STRUCT_LAYOUT_MEMBER_COUNT_LESS:
		initialization = "{ { {0, 1, 0, 1}, vec3(0, 1, 0) } }";

		break;

	case STRUCT_LAYOUT_MEMBER_ORDER:
		initialization = "{ vec4(1, 0, 1, 0), { vec3(0, 1, 0) , {0, 1, 0, 1} } }";

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return initialization;
}